

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_MNSV_UnexistingDomainResolveFails_Test::TestBody
          (InterpreterTestSuite_MNSV_UnexistingDomainResolveFails_Test *this)

{
  pointer *this_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  string local_600;
  AssertHelper local_5e0;
  Message local_5d8;
  Value local_5d0;
  bool local_581;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_;
  Message local_568;
  ErrorCode local_55c;
  Error local_558;
  ErrorCode local_52c;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_1;
  string local_510;
  Expression local_4f0;
  undefined1 local_4d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  Expression ret;
  Expression expr;
  AssertHelper local_488;
  Message local_480;
  Status local_471;
  UnixTime local_470;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_418;
  allocator local_3f1;
  string local_3f0;
  Timestamp local_3d0;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  State local_350;
  allocator local_349;
  string local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  allocator local_301;
  string local_300;
  BorderAgent local_2e0;
  Status local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_MNSV_UnexistingDomainResolveFails_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"127.0.0.1",&local_301);
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"1.1",&local_349);
  ot::commissioner::BorderAgent::State::State(&local_350,0,0,0,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"net1",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"",&local_3c1);
  local_3d0 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"",&local_3f1);
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_438,"domain1",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"",&local_461);
  ot::commissioner::UnixTime::UnixTime(&local_470,0);
  pcVar3 = (char *)(ulong)(uint)local_350;
  ot::commissioner::BorderAgent::BorderAgent
            (&local_2e0,&local_300,0x4e21,&local_328,&local_348,local_350,&local_370,1,&local_398,
             &local_3c0,local_3d0,0,&local_3f0,&local_418,&local_438,'\0',0,&local_460,local_470,
             0x103f);
  local_161 = ot::commissioner::persistent_storage::Registry::Add
                        ((Registry *)ctx.mInterpreter._192_8_,&local_2e0);
  local_471 = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
            ((EqHelper *)local_160,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_161,&local_471);
  ot::commissioner::BorderAgent::~BorderAgent(&local_2e0);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_418);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ret.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_510,"start --dom domain2",
               (allocator *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    ot::commissioner::Interpreter::ParseExpression(&local_4f0,(Interpreter *)local_140,&local_510);
    this_00 = &ret.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,&local_4f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
              (&local_558,(Interpreter *)local_140,(Expression *)this_00,
               (Expression *)
               &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_52c = ot::commissioner::Error::GetCode(&local_558);
    local_55c = kNone;
    testing::internal::EqHelper::
    Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
              ((EqHelper *)local_528,
               "ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode()","ErrorCode::kNone",
               &local_52c,&local_55c);
    ot::commissioner::Error::~Error(&local_558);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
    if (!bVar1) {
      testing::Message::Message(&local_568);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x170,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_568);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_568);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
    ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
              (&local_5d0,(Interpreter *)local_140,
               (Expression *)
               &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8);
    bVar1 = ot::commissioner::Interpreter::Value::HasNoError(&local_5d0);
    local_581 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_580,&local_581,(type *)0x0);
    ot::commissioner::Interpreter::Value::~Value(&local_5d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
    if (!bVar1) {
      testing::Message::Message(&local_5d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_600,(internal *)local_580,
                 (AssertionResult *)
                 "ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError()","true",
                 "false",pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x171,pcVar3);
      testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
      testing::internal::AssertHelper::~AssertHelper(&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      testing::Message::~Message(&local_5d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ret.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNSV_UnexistingDomainResolveFails)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    Interpreter::Expression expr, ret;
    std::vector<uint64_t>   nids;
    expr = ctx.mInterpreter.ParseExpression("start --dom domain2");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_FALSE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
}